

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

void Pdr_ManDumpClauses(Pdr_Man_t *p,char *pFileName,int fProved)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  Vec_Ptr_t *p_00;
  void *pvVar3;
  Vec_Int_t *vFlopCounts_00;
  Abc_Frame_t *p_01;
  Abc_Ntk_t *pNtk;
  char **__ptr;
  Pdr_Set_t *p_02;
  uint uVar4;
  long lVar5;
  int iVar6;
  _func_int_varargs *Vec_PtrSortCompare;
  char *pcVar7;
  Vec_Int_t *vFlopCounts;
  
  Vec_PtrSortCompare = (_func_int_varargs *)0x7b54e8;
  pcVar7 = pFileName;
  __stream = fopen(pFileName,"w");
  iVar6 = (int)pcVar7;
  if (__stream == (FILE *)0x0) {
    pcVar7 = "Cannot open file \"%s\" for writing invariant.\n";
  }
  else {
    uVar1 = Pdr_ManFindInvariantStart(p);
    if (fProved == 0) {
      p_00 = Vec_PtrDup(p->vInfCubes);
    }
    else {
      Vec_PtrSortCompare = (_func_int_varargs *)(ulong)uVar1;
      p_00 = Pdr_ManCollectCubes(p,uVar1);
    }
    Vec_PtrSort(p_00,Vec_PtrSortCompare);
    uVar4 = 0;
    for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(p_00,iVar6);
      uVar4 = uVar4 + (*(int *)((long)pvVar3 + 8) != -1);
    }
    vFlopCounts_00 = Pdr_ManCountFlops(p,p_00);
    pcVar7 = "# Inductive invariant for \"%s\"\n";
    if (fProved == 0) {
      pcVar7 = "# Clauses of the last timeframe for \"%s\"\n";
    }
    iVar6 = 0;
    vFlopCounts = vFlopCounts_00;
    fprintf(__stream,pcVar7,p->pAig->pName);
    pcVar7 = Aig_TimeStamp();
    fprintf(__stream,"# generated by PDR in ABC on %s\n",pcVar7);
    uVar1 = Pdr_ManCountVariables(p,uVar1);
    fprintf(__stream,".i %d\n",(ulong)uVar1);
    fwrite(".o 1\n",5,1,__stream);
    fprintf(__stream,".p %d\n",(ulong)uVar4);
    p_01 = Abc_FrameReadGlobalFrame();
    pNtk = Abc_FrameReadNtk(p_01);
    __ptr = Abc_NtkCollectCioNames(pNtk,0);
    if (__ptr != (char **)0x0) {
      fwrite(".ilb",4,1,__stream);
      for (lVar5 = 0; (int)lVar5 < p->pAig->nRegs; lVar5 = lVar5 + 1) {
        iVar2 = Vec_IntEntry(vFlopCounts_00,(int)lVar5);
        if (iVar2 != 0) {
          fprintf(__stream," %s",__ptr[p->pAig->nTruePis + lVar5]);
        }
      }
      fputc(10,__stream);
      free(__ptr);
      fwrite(".ob inv\n",8,1,__stream);
    }
    for (; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
      p_02 = (Pdr_Set_t *)Vec_PtrEntry(p_00,iVar6);
      if (p_02->nRefs != -1) {
        Pdr_SetPrint((FILE *)__stream,p_02,p->pAig->nRegs,vFlopCounts_00);
        fwrite(" 1\n",3,1,__stream);
      }
    }
    fwrite(".e\n\n",4,1,__stream);
    fclose(__stream);
    Vec_IntFreeP(&vFlopCounts);
    Vec_PtrFree(p_00);
    iVar6 = (int)p_00;
    pcVar7 = "Inductive invariant was written into file \"%s\".\n";
    if (fProved == 0) {
      pcVar7 = "Clauses of the last timeframe were written into file \"%s\".\n";
    }
  }
  Abc_Print(iVar6,pcVar7,pFileName);
  return;
}

Assistant:

void Pdr_ManDumpClauses( Pdr_Man_t * p, char * pFileName, int fProved )
{
    int fUseSupp = 1;
    FILE * pFile;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    char ** pNamesCi;
    int i, kStart, Count = 0;
    // create file
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file \"%s\" for writing invariant.\n", pFileName );
        return;
    } 
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( fProved )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
//    Pdr_ManDumpAig( p->pAig, vCubes );
    // count cubes
    Count = 0;
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Count++;
    }
    // collect variable appearances
    vFlopCounts = fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output the header
    if ( fProved )
        fprintf( pFile, "# Inductive invariant for \"%s\"\n", p->pAig->pName );
    else
        fprintf( pFile, "# Clauses of the last timeframe for \"%s\"\n", p->pAig->pName );
    fprintf( pFile, "# generated by PDR in ABC on %s\n", Aig_TimeStamp() );
    fprintf( pFile, ".i %d\n", fUseSupp ? Pdr_ManCountVariables(p, kStart) : Aig_ManRegNum(p->pAig) );
    fprintf( pFile, ".o 1\n" );
    fprintf( pFile, ".p %d\n", Count );
    // output flop names
    pNamesCi = Abc_NtkCollectCioNames( Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() ), 0 );
    if ( pNamesCi )
    {
        fprintf( pFile, ".ilb" );
        for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
            if ( !fUseSupp || Vec_IntEntry( vFlopCounts, i ) )
                fprintf( pFile, " %s", pNamesCi[Saig_ManPiNum(p->pAig) + i] );
        fprintf( pFile, "\n" );
        ABC_FREE( pNamesCi );
        fprintf( pFile, ".ob inv\n" );
    }
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrint( pFile, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
        fprintf( pFile, " 1\n" ); 
    }
    fprintf( pFile, ".e\n\n" );
    fclose( pFile );
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    if ( fProved )
        Abc_Print( 1, "Inductive invariant was written into file \"%s\".\n", pFileName );
    else
        Abc_Print( 1, "Clauses of the last timeframe were written into file \"%s\".\n", pFileName );
}